

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O2

void P_RunEffects(void)

{
  uint uVar1;
  AActor *pAVar2;
  int iVar3;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator local_40;
  
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
  if (pAVar2 == (AActor *)0x0) {
    return;
  }
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
  iVar3 = (int)(((long)pAVar2->Sector - (long)sectors) / 0x218) * numsectors;
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&local_40,0x80);
  while (pAVar2 = (AActor *)FThinkerIterator::Next(&local_40,false), pAVar2 != (AActor *)0x0) {
    if ((pAVar2->effects != 0) &&
       ((rejectmatrix == (BYTE *)0x0 ||
        (uVar1 = (int)(((long)pAVar2->Sector - (long)sectors) / 0x218) + iVar3,
        (rejectmatrix[(int)uVar1 >> 3] >> (uVar1 & 7) & 1) == 0)))) {
      P_RunEffect(pAVar2,pAVar2->effects);
    }
  }
  return;
}

Assistant:

void P_RunEffects ()
{
	if (players[consoleplayer].camera == NULL) return;

	int	pnum = int(players[consoleplayer].camera->Sector - sectors) * numsectors;

	AActor *actor;
	TThinkerIterator<AActor> iterator;

	while ( (actor = iterator.Next ()) )
	{
		if (actor->effects)
		{
			// Only run the effect if the actor is potentially visible
			int rnum = pnum + int(actor->Sector - sectors);
			if (rejectmatrix == NULL || !(rejectmatrix[rnum>>3] & (1 << (rnum & 7))))
				P_RunEffect (actor, actor->effects);
		}
	}
}